

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O2

void __thiscall duckdb::PartialBlock::FlushInternal(PartialBlock *this,idx_t free_space_left)

{
  BufferManager *pBVar1;
  pointer pUVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  UninitializedRegion *uninitialized;
  pointer pUVar5;
  BufferHandle buffer_handle;
  BufferHandle local_40;
  
  if ((free_space_left != 0) ||
     ((this->uninitialized_regions).
      super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->uninitialized_regions).
      super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    pBVar1 = this->block_manager->buffer_manager;
    (*pBVar1->_vptr_BufferManager[7])(&local_40,pBVar1,&this->block_handle);
    pUVar2 = (this->uninitialized_regions).
             super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             .
             super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pUVar5 = (this->uninitialized_regions).
                  super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
                  .
                  super__Vector_base<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
                  ._M_impl.super__Vector_impl_data._M_start; pUVar5 != pUVar2; pUVar5 = pUVar5 + 1)
    {
      pdVar3 = BufferHandle::Ptr(&local_40);
      switchD_016d4fed::default(pdVar3 + pUVar5->start,0,pUVar5->end - pUVar5->start);
    }
    pdVar3 = BufferHandle::Ptr(&local_40);
    iVar4 = BlockManager::GetBlockSize(this->block_manager);
    switchD_016d4fed::default(pdVar3 + (iVar4 - free_space_left),0,free_space_left);
    BufferHandle::~BufferHandle(&local_40);
  }
  return;
}

Assistant:

void PartialBlock::FlushInternal(const idx_t free_space_left) {

	// ensure that we do not leak any data
	if (free_space_left > 0 || !uninitialized_regions.empty()) {
		auto buffer_handle = block_manager.buffer_manager.Pin(block_handle);

		// memset any uninitialized regions
		for (auto &uninitialized : uninitialized_regions) {
			memset(buffer_handle.Ptr() + uninitialized.start, 0, uninitialized.end - uninitialized.start);
		}
		// memset any free space at the end of the block to 0 prior to writing to disk
		memset(buffer_handle.Ptr() + block_manager.GetBlockSize() - free_space_left, 0, free_space_left);
	}
}